

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point-to-point.cpp
# Opt level: O0

request diy::mpi::detail::issend
                  (DIY_MPI_Comm comm,int dest,int tag,void *data,int count,datatype *type)

{
  MPI_Datatype poVar1;
  MPI_Comm poVar2;
  MPI_Datatype *ppoVar3;
  MPI_Comm *ppoVar4;
  MPI_Request *ppoVar5;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 in_R8D;
  DIY_MPI_Datatype *in_R9;
  request r;
  DIY_MPI_Comm local_10;
  DIY_MPI_Request local_8;
  
  request::request((request *)&local_8);
  ppoVar3 = mpi_cast(in_R9);
  poVar1 = *ppoVar3;
  ppoVar4 = mpi_cast(&local_10);
  poVar2 = *ppoVar4;
  ppoVar5 = mpi_cast(&local_8);
  MPI_Issend(in_RCX,in_R8D,poVar1,in_ESI,in_EDX,poVar2,ppoVar5);
  return (request)(DIY_MPI_Request)local_8.data;
}

Assistant:

request issend(DIY_MPI_Comm comm, int dest, int tag, const void* data, int count, const datatype& type)
{
#if DIY_HAS_MPI
  request r;
  MPI_Issend(data, count, mpi_cast(type.handle), dest, tag, mpi_cast(comm), &mpi_cast(r.handle));
  return r;
#else
  (void) comm; (void) dest; (void) tag; (void) data; (void) count; (void) type;
  DIY_UNSUPPORTED_MPI_CALL(MPI_Issend);
#endif
}